

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  char *pcVar1;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  TestCaseException *e_local;
  JUnitReporter *this_local;
  
  lock._M_device = (mutex_type *)e;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"exception",&local_41);
  pcVar1 = String::c_str((String *)lock._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar1,&local_79);
  JUnitTestCaseData::addError(&this->testCaseData,(string *)local_40,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            testCaseData.addError("exception", e.error_string.c_str());
        }